

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cc
# Opt level: O0

bool perform_integrity_check(uint8_t *buf,size_t buf_len,uint32_t checksum,crc_mode_e mode)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  size_t in_RSI;
  void *in_RDI;
  bool success;
  
  uVar1 = crc32_8(in_RDI,in_RSI,0);
  return in_EDX == uVar1;
}

Assistant:

bool perform_integrity_check(const uint8_t* buf,
                            size_t buf_len,
                            uint32_t checksum,
                            crc_mode_e mode) {
    bool success = false;
#ifdef _CRC32C
    if (mode == CRC_UNKNOWN || mode == CRC32C) {
        success = checksum == crc32c(buf, buf_len, 0);
        if (!success && mode == CRC_UNKNOWN) {
            success = checksum == crc32_8((void *)buf, buf_len, 0);
        }
    } else
#endif
    {
        success = checksum == crc32_8((void *)buf, buf_len, 0);
    }
    return success;
}